

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void TR_Cond(ast *node,C_OP *lt,C_OP *lf)

{
  IrSim *pIVar1;
  ast *place;
  IrSim *ic;
  C_OP *in_RDX;
  ast *in_RSI;
  ast *in_RDI;
  Operand t2;
  Operand t1;
  C_IC *in_stack_fffffffffffffc38;
  IrSim *in_stack_fffffffffffffc40;
  IrSim *this;
  IrSim *in_stack_fffffffffffffc48;
  C_OP *in_stack_fffffffffffffc50;
  int kind;
  IrSim *in_stack_fffffffffffffc58;
  ast *in_stack_fffffffffffffc60;
  ast *node_00;
  IrSim *in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffd2f;
  C_OP *in_stack_fffffffffffffd30;
  C_OP *in_stack_fffffffffffffd38;
  ast *in_stack_fffffffffffffd40;
  undefined1 local_248 [512];
  C_OP *in_stack_ffffffffffffffe0;
  
  Operand::Operand((Operand *)in_stack_fffffffffffffc40);
  Operand::Operand((Operand *)in_stack_fffffffffffffc40);
  switch(in_RDI->type) {
  case 0x107:
    IrSim::newTmpVar(in_stack_fffffffffffffca8);
    Operand::operator=((Operand *)in_stack_fffffffffffffc40,(Operand *)in_stack_fffffffffffffc38);
    Operand::~Operand((Operand *)0x113ac4);
    IrSim::newTmpVar(in_stack_fffffffffffffca8);
    node_00 = (ast *)(local_248 + 0x160);
    Operand::operator=((Operand *)in_stack_fffffffffffffc40,(Operand *)in_stack_fffffffffffffc38);
    Operand::~Operand((Operand *)0x113afe);
    pIVar1 = (IrSim *)sibling(in_RDI,-1);
    TR_Exp(node_00,(C_OP *)in_stack_fffffffffffffc58);
    place = sibling(in_RDI,1);
    TR_Exp(node_00,(C_OP *)place);
    IrSim::icIfGoto(pIVar1,node_00,(C_OP *)place,in_stack_fffffffffffffc50,
                    (C_OP *)in_stack_fffffffffffffc48);
    IrSim::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    IrSim::icGoto(in_stack_fffffffffffffc48,(C_OP *)in_stack_fffffffffffffc40);
    IrSim::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffc40);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffc40);
    break;
  default:
    IrSim::newTmpVar(in_stack_fffffffffffffca8);
    kind = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
    pIVar1 = (IrSim *)&stack0xffffffffffffffb8;
    this = (IrSim *)local_248;
    Operand::operator=((Operand *)this,(Operand *)in_stack_fffffffffffffc38);
    Operand::~Operand((Operand *)0x113c82);
    TR_Exp(in_stack_fffffffffffffc60,(C_OP *)in_stack_fffffffffffffc58);
    IrSim::icIfGoto(in_stack_fffffffffffffc58,kind,(C_OP *)pIVar1,(C_OP *)this,
                    (C_OP *)in_stack_fffffffffffffc38);
    ic = IrSim::operator<<(this,in_stack_fffffffffffffc38);
    IrSim::icGoto(pIVar1,(C_OP *)this);
    IrSim::operator<<(this,(C_IC *)ic);
    InterCode::~InterCode((InterCode *)this);
    InterCode::~InterCode((InterCode *)this);
    break;
  case 0x10c:
    TR_AND_OR(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
              (bool)in_stack_fffffffffffffd2f);
    break;
  case 0x10d:
    TR_AND_OR(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
              (bool)in_stack_fffffffffffffd2f);
    break;
  case 0x10f:
    sibling(in_RDI,1);
    TR_Cond(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  }
  Operand::~Operand((Operand *)0x113d31);
  Operand::~Operand((Operand *)0x113d3e);
  return;
}

Assistant:

static void TR_Cond(ast *node, C_OP &lt, C_OP &lf) {
    Operand t1, t2;
    switch (node->type) {
        case NOT:
            TR_Cond(sibling(node, 1), lf, lt);
            break;
        case OR: // no break
            TR_AND_OR(node, lt, lf, false);
            break;
        case AND:
            TR_AND_OR(node, lt, lf, true);
            break;
        case RELOP:
            t1 = irSim.newTmpVar();
            t2 = irSim.newTmpVar();
            TR_Exp(sibling(node, -1), t1);
            TR_Exp(sibling(node, 1), t2);
            irSim << irSim.icIfGoto(node, lt, t1, t2) << irSim.icGoto(lf);
            break;
        default:
            t1 = irSim.newTmpVar();
            TR_Exp(node, t1);
            irSim << irSim.icIfGoto(IC_NE, lt, t1, OP_ZERO) << irSim.icGoto(lf);
    }
}